

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

Space skip_whitespace(Env *env)

{
  _Bool _Var1;
  undefined4 local_14;
  Space space;
  Env *env_local;
  
  local_14 = NoSpace;
  while( true ) {
    while (_Var1 = skip_space(env), _Var1) {
      local_14 = Indented;
    }
    _Var1 = skip_newlines(env);
    if (!_Var1) break;
    local_14 = BOL;
  }
  return local_14;
}

Assistant:

static Space skip_whitespace(Env *env) {
  Space space = NoSpace;
  while (true) {
    if (skip_space(env)) space = Indented;
    else if (skip_newlines(env)) space = BOL;
    else return space;
  };
}